

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O2

cse_abstract * __thiscall
factory_item<xray_re::se_smart_cover>::create(factory_item<xray_re::se_smart_cover> *this)

{
  se_smart_cover *this_00;
  
  this_00 = (se_smart_cover *)operator_new(0x198);
  xray_re::se_smart_cover::se_smart_cover(this_00);
  (this_00->super_cse_smart_cover).super_cse_alife_dynamic_object.super_cse_alife_object.
  super_cse_abstract.m_clsid.field_0 = (this->super_factory_item_base).m_clsid.field_0;
  return (cse_abstract *)&(this_00->super_cse_smart_cover).super_cse_alife_dynamic_object;
}

Assistant:

cse_abstract* factory_item<T>::create()
{
	T* p = new T;
	p->clsid() = clsid();
	return p;
}